

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int IDASetLinearSolver(void *ida_mem,SUNLinearSolver LS,SUNMatrix A)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  IDALsMem idals_mem_00;
  N_Vector p_Var4;
  long lVar5;
  code *pcVar6;
  SUNMatrix in_RDX;
  SUNLinearSolver in_RSI;
  IDAMem in_RDI;
  int matrixbased;
  int iterative;
  int LSType;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  sunrealtype local_50;
  bool local_41;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x62,"IDASetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RSI == (SUNLinearSolver)0x0) {
    IDAProcessError((IDAMem)0x0,-3,0x68,"IDASetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"LS must be non-NULL");
    local_4 = -3;
  }
  else if ((in_RSI->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
          (in_RSI->ops->solve ==
           (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    IDAProcessError(in_RDI,-3,0x71,"IDASetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"LS object is missing a required operation");
    local_4 = -3;
  }
  else {
    iVar1 = SUNLinSolGetType(in_RSI);
    uVar2 = (uint)(iVar1 != 0);
    local_41 = iVar1 != 1 && iVar1 != 3;
    uVar3 = (uint)local_41;
    if ((in_RDI->ida_tempv1->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) ||
       (in_RDI->ida_tempv1->ops->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) {
      IDAProcessError(in_RDI,-3,0x82,"IDASetLinearSolver",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else if ((iVar1 == 3) && (in_RDX != (SUNMatrix)0x0)) {
      IDAProcessError(in_RDI,-3,0x8a,"IDASetLinearSolver",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                      ,"Incompatible inputs: matrix-embedded LS requires NULL matrix");
      local_4 = -3;
    }
    else {
      if (uVar2 == 0) {
        if (in_RDX == (SUNMatrix)0x0) {
          IDAProcessError(in_RDI,-3,0xb4,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"Incompatible inputs: direct LS requires non-NULL matrix");
          return -3;
        }
      }
      else {
        if (in_RDI->ida_tempv1->ops->nvgetlength == (_func_sunindextype_N_Vector *)0x0) {
          IDAProcessError(in_RDI,-3,0x94,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"A required vector operation is not implemented.");
          return -3;
        }
        if ((iVar1 != 3) &&
           ((in_RSI->ops->resid == (_func_N_Vector_SUNLinearSolver *)0x0 ||
            (in_RSI->ops->numiters == (_func_int_SUNLinearSolver *)0x0)))) {
          IDAProcessError(in_RDI,-3,0x9d,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"Iterative LS object requires \'resid\' and \'numiters\' routines");
          return -3;
        }
        if (((uVar3 == 0) && (iVar1 != 3)) &&
           (in_RSI->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0))
        {
          IDAProcessError(in_RDI,-3,0xa6,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"Incompatible inputs: iterative LS must support ATimes routine");
          return -3;
        }
        if ((uVar3 != 0) && (in_RDX == (SUNMatrix)0x0)) {
          IDAProcessError(in_RDI,-3,0xad,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
          return -3;
        }
      }
      if (in_RDI->ida_lfree != (_func_int_IDAMemRec_ptr *)0x0) {
        (*in_RDI->ida_lfree)(in_RDI);
      }
      in_RDI->ida_linit = idaLsInitialize;
      in_RDI->ida_lsetup = idaLsSetup;
      in_RDI->ida_lsolve = idaLsSolve;
      in_RDI->ida_lfree = idaLsFree;
      pcVar6 = (_func_int_IDAMemRec_ptr_int *)0x0;
      if (uVar2 != 0) {
        pcVar6 = idaLsPerf;
      }
      in_RDI->ida_lperf = pcVar6;
      idals_mem_00 = (IDALsMem)malloc(0x148);
      if (idals_mem_00 == (IDALsMem)0x0) {
        IDAProcessError(in_RDI,-4,0xca,"IDASetLinearSolver",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                        ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        memset(idals_mem_00,0,0x148);
        idals_mem_00->LS = in_RSI;
        idals_mem_00->iterative = uVar2;
        idals_mem_00->matrixbased = uVar3;
        idals_mem_00->J = in_RDX;
        if (in_RDX == (SUNMatrix)0x0) {
          idals_mem_00->jacDQ = 0;
          idals_mem_00->jac = (IDALsJacFn)0x0;
          idals_mem_00->J_data = (void *)0x0;
        }
        else {
          idals_mem_00->jacDQ = 1;
          idals_mem_00->jac = idaLsDQJac;
          idals_mem_00->J_data = in_RDI;
        }
        idals_mem_00->jtimesDQ = 1;
        idals_mem_00->jtsetup = (IDALsJacTimesSetupFn)0x0;
        idals_mem_00->jtimes = idaLsDQJtimes;
        idals_mem_00->jt_res = in_RDI->ida_res;
        idals_mem_00->jt_data = in_RDI;
        idals_mem_00->pset = (IDALsPrecSetupFn)0x0;
        idals_mem_00->psolve = (IDALsPrecSolveFn)0x0;
        idals_mem_00->pfree = (_func_int_IDAMem *)0x0;
        idals_mem_00->pdata = in_RDI->ida_user_data;
        idaLsInitializeCounters(idals_mem_00);
        idals_mem_00->eplifac = 0.05;
        idals_mem_00->dqincfac = 1.0;
        idals_mem_00->last_flag = 0;
        if ((in_RSI->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)
           || (iVar1 = SUNLinSolSetATimes(in_RSI,in_RDI,idaLsATimes), iVar1 == 0)) {
          if ((in_RSI->ops->setpreconditioner ==
               (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
             (iVar1 = SUNLinSolSetPreconditioner(in_RSI,in_RDI,0), iVar1 == 0)) {
            p_Var4 = (N_Vector)N_VClone(in_RDI->ida_tempv1);
            idals_mem_00->ytemp = p_Var4;
            if (idals_mem_00->ytemp == (N_Vector)0x0) {
              IDAProcessError(in_RDI,-4,0x119,"IDASetLinearSolver",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                              ,"A memory request failed.");
              free(idals_mem_00);
              local_4 = -4;
            }
            else {
              p_Var4 = (N_Vector)N_VClone(in_RDI->ida_tempv1);
              idals_mem_00->yptemp = p_Var4;
              if (idals_mem_00->yptemp == (N_Vector)0x0) {
                IDAProcessError(in_RDI,-4,0x123,"IDASetLinearSolver",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                                ,"A memory request failed.");
                N_VDestroy(idals_mem_00->ytemp);
                free(idals_mem_00);
                local_4 = -4;
              }
              else {
                p_Var4 = (N_Vector)N_VClone(in_RDI->ida_tempv1);
                idals_mem_00->x = p_Var4;
                if (idals_mem_00->x == (N_Vector)0x0) {
                  IDAProcessError(in_RDI,-4,0x12e,"IDASetLinearSolver",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                                  ,"A memory request failed.");
                  N_VDestroy(idals_mem_00->ytemp);
                  N_VDestroy(idals_mem_00->yptemp);
                  free(idals_mem_00);
                  local_4 = -4;
                }
                else {
                  if (uVar2 != 0) {
                    lVar5 = N_VGetLength(idals_mem_00->ytemp);
                    if (0.0 < (double)lVar5) {
                      lVar5 = N_VGetLength(idals_mem_00->ytemp);
                      local_50 = sqrt((double)lVar5);
                    }
                    else {
                      local_50 = 0.0;
                    }
                    idals_mem_00->nrmfac = local_50;
                  }
                  if (uVar3 == 0) {
                    idals_mem_00->scalesol = 0;
                  }
                  else {
                    idals_mem_00->scalesol = 1;
                  }
                  in_RDI->ida_lmem = idals_mem_00;
                  local_4 = 0;
                }
              }
            }
          }
          else {
            IDAProcessError(in_RDI,-9,0x10d,"IDASetLinearSolver",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                            ,"Error in calling SUNLinSolSetPreconditioner");
            free(idals_mem_00);
            local_4 = -9;
          }
        }
        else {
          IDAProcessError(in_RDI,-9,0xff,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"Error in calling SUNLinSolSetATimes");
          free(idals_mem_00);
          local_4 = -9;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int IDASetLinearSolver(void* ida_mem, SUNLinearSolver LS, SUNMatrix A)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if any input is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  if (LS == NULL)
  {
    IDAProcessError(NULL, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (IDALS_ILL_INPUT);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (IDALS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if (IDA_mem->ida_tempv1->ops->nvconst == NULL ||
      IDA_mem->ida_tempv1->ops->nvwrmsnorm == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (IDALS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (IDA_mem->ida_tempv1->ops->nvgetlength == NULL)
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (IDALS_ILL_INPUT);
    }

    if (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED)
    {
      if (LS->ops->resid == NULL || LS->ops->numiters == NULL)
      {
        IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "Iterative LS object requires 'resid' and 'numiters' routines");
        return (IDALS_ILL_INPUT);
      }
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (IDALS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL))
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (IDALS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (IDALS_ILL_INPUT);
  }

  /* free any existing system solver attached to IDA */
  if (IDA_mem->ida_lfree) { IDA_mem->ida_lfree(IDA_mem); }

  /* Set four main system linear solver function fields in IDA_mem */
  IDA_mem->ida_linit  = idaLsInitialize;
  IDA_mem->ida_lsetup = idaLsSetup;
  IDA_mem->ida_lsolve = idaLsSolve;
  IDA_mem->ida_lfree  = idaLsFree;

  /* Set ida_lperf if using an iterative SUNLinearSolver object */
  IDA_mem->ida_lperf = (iterative) ? idaLsPerf : NULL;

  /* Allocate memory for IDALsMemRec */
  idals_mem = NULL;
  idals_mem = (IDALsMem)malloc(sizeof(struct IDALsMemRec));
  if (idals_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  memset(idals_mem, 0, sizeof(struct IDALsMemRec));

  /* set SUNLinearSolver pointer */
  idals_mem->LS = LS;

  /* Linear solver type information */
  idals_mem->iterative   = iterative;
  idals_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  idals_mem->J = A;
  if (A != NULL)
  {
    idals_mem->jacDQ  = SUNTRUE;
    idals_mem->jac    = idaLsDQJac;
    idals_mem->J_data = IDA_mem;
  }
  else
  {
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = NULL;
    idals_mem->J_data = NULL;
  }
  idals_mem->jtimesDQ = SUNTRUE;
  idals_mem->jtsetup  = NULL;
  idals_mem->jtimes   = idaLsDQJtimes;
  idals_mem->jt_res   = IDA_mem->ida_res;
  idals_mem->jt_data  = IDA_mem;

  /* Set defaults for preconditioner-related fields */
  idals_mem->pset   = NULL;
  idals_mem->psolve = NULL;
  idals_mem->pfree  = NULL;
  idals_mem->pdata  = IDA_mem->ida_user_data;

  /* Initialize counters */
  idaLsInitializeCounters(idals_mem);

  /* Set default values for the rest of the Ls parameters */
  idals_mem->eplifac   = PT05;
  idals_mem->dqincfac  = ONE;
  idals_mem->last_flag = IDALS_SUCCESS;

  /* If LS supports ATimes, attach IDALs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, IDA_mem, idaLsATimes);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(idals_mem);
      idals_mem = NULL;
      return (IDALS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, IDA_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(idals_mem);
      idals_mem = NULL;
      return (IDALS_SUNLS_FAIL);
    }
  }

  /* Allocate memory for ytemp, yptemp and x */
  idals_mem->ytemp = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->ytemp == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  idals_mem->yptemp = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->yptemp == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    N_VDestroy(idals_mem->ytemp);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  idals_mem->x = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->x == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    N_VDestroy(idals_mem->ytemp);
    N_VDestroy(idals_mem->yptemp);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  /* For iterative LS, compute sqrtN */
  if (iterative)
  {
    idals_mem->nrmfac = SUNRsqrt(N_VGetLength(idals_mem->ytemp));
  }

  /* For matrix-based LS, enable solution scaling */
  if (matrixbased) { idals_mem->scalesol = SUNTRUE; }
  else { idals_mem->scalesol = SUNFALSE; }

  /* Attach linear solver memory to integrator memory */
  IDA_mem->ida_lmem = idals_mem;

  return (IDALS_SUCCESS);
}